

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int adjust_rtc_keyframe(RATE_CONTROL *rc,int enumerator)

{
  int iVar1;
  int iVar2;
  int enumerator_local;
  RATE_CONTROL *rc_local;
  int local_4;
  
  local_4 = enumerator;
  if (rc->perc_spatial_flat_blocks < 0x47) {
    if ((rc->last_encoded_size_keyframe == 0) ||
       (rc->frames_since_scene_change < rc->frames_since_key)) {
      if ((rc->frame_spatial_variance < 0x3e9) &&
         ((rc->frame_spatial_variance < 0x1f5 || (rc->perc_spatial_flat_blocks != 0)))) {
        if ((rc->frame_spatial_variance < 0x1f5) || (9 < rc->perc_spatial_flat_blocks)) {
          if (400 < rc->frame_spatial_variance) {
            local_4 = enumerator << 1;
          }
        }
        else {
          local_4 = enumerator << 2;
        }
      }
      else {
        local_4 = enumerator << 3;
      }
    }
    else if (rc->frames_since_key <= rc->frames_since_scene_change) {
      if ((rc->last_target_size_keyframe * 4 < rc->last_encoded_size_keyframe) &&
         (500 < rc->frame_spatial_variance)) {
        local_4 = enumerator << 3;
      }
      else {
        iVar1 = rc->last_encoded_size_keyframe;
        iVar2 = rc->last_target_size_keyframe * 2;
        if ((iVar1 == iVar2 ||
             SBORROW4(iVar1,iVar2) != iVar1 + rc->last_target_size_keyframe * -2 < 0) ||
           (rc->frame_spatial_variance < 0xc9)) {
          if (rc->last_target_size_keyframe < rc->last_encoded_size_keyframe) {
            local_4 = enumerator << 1;
          }
        }
        else {
          local_4 = enumerator << 2;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int adjust_rtc_keyframe(const RATE_CONTROL *rc, int enumerator) {
  // Don't adjust if most of the image is flat.
  if (rc->perc_spatial_flat_blocks > 70) return enumerator;
  if (rc->last_encoded_size_keyframe == 0 ||
      rc->frames_since_scene_change < rc->frames_since_key) {
    // Very first frame, or if scene change happened after last keyframe.
    if (rc->frame_spatial_variance > 1000 ||
        (rc->frame_spatial_variance > 500 && rc->perc_spatial_flat_blocks == 0))
      return enumerator << 3;
    else if (rc->frame_spatial_variance > 500 &&
             rc->perc_spatial_flat_blocks < 10)
      return enumerator << 2;
    else if (rc->frame_spatial_variance > 400)
      return enumerator << 1;
  } else if (rc->frames_since_scene_change >= rc->frames_since_key) {
    // There was no scene change before previous encoded keyframe, so
    // use the last_encoded/target_size_keyframe.
    if (rc->last_encoded_size_keyframe > 4 * rc->last_target_size_keyframe &&
        rc->frame_spatial_variance > 500)
      return enumerator << 3;
    else if (rc->last_encoded_size_keyframe >
                 2 * rc->last_target_size_keyframe &&
             rc->frame_spatial_variance > 200)
      return enumerator << 2;
    else if (rc->last_encoded_size_keyframe > rc->last_target_size_keyframe)
      return enumerator << 1;
  }
  return enumerator;
}